

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::error<unsigned_long&,unsigned_long&>
          (ValidationContext *this,IssueError *issue,unsigned_long *args,unsigned_long *args_1)

{
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args_00;
  string_view fmt;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  unsigned_long local_48 [2];
  unsigned_long local_38;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_90[0] = (issue->super_Issue).type;
  local_90._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_48[0] = *args;
  local_38 = *args_1;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_48;
  fmt.size_ = 0x44;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_68,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }